

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

void ZSTD_overflowCorrectIfNeeded
               (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,void *ip,void *iend)

{
  BYTE **ppBVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  void *pvVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  U32 UVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  U32 UVar15;
  uint uVar16;
  
  uVar10 = 1 << ((byte)(params->cParams).windowLog & 0x1f);
  pBVar2 = (ms->window).base;
  iVar7 = (int)pBVar2;
  if (0xe0000000 < (uint)((int)iend - iVar7)) {
    uVar5 = 1 << ((char)(params->cParams).chainLog - (ZSTD_lazy2 < (params->cParams).strategy) &
                 0x1fU);
    uVar16 = (int)ip - iVar7;
    uVar12 = uVar5 - 1 & uVar16;
    uVar13 = 2;
    if (2 < uVar5) {
      uVar13 = uVar5;
    }
    uVar6 = 0;
    if (uVar12 < 2) {
      uVar6 = uVar13;
    }
    uVar13 = uVar5;
    if (uVar5 <= uVar10) {
      uVar13 = uVar10;
    }
    uVar6 = uVar13 + uVar12 + uVar6;
    if (uVar12 != (uVar5 - 1 & uVar6)) {
      __assert_fail("(curr & cycleMask) == (newCurrent & cycleMask)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x447,
                    "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
    }
    if (uVar16 <= uVar6) {
      __assert_fail("curr > newCurrent",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x448,
                    "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
    }
    uVar16 = uVar16 - uVar6;
    if (uVar16 < 0x10000001) {
      __assert_fail("correction > 1<<28",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,1099,"U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)"
                   );
    }
    (ms->window).base = pBVar2 + uVar16;
    ppBVar1 = &(ms->window).dictBase;
    *ppBVar1 = *ppBVar1 + uVar16;
    uVar5 = (ms->window).dictLimit;
    uVar12 = (ms->window).lowLimit;
    uVar13 = uVar16 + 2;
    uVar9 = uVar12 - uVar16;
    if (uVar12 < uVar13) {
      uVar9 = 2;
    }
    uVar12 = uVar5 - uVar16;
    if (uVar5 < uVar13) {
      uVar12 = 2;
    }
    (ms->window).lowLimit = uVar9;
    (ms->window).dictLimit = uVar12;
    if (uVar6 < uVar10) {
      __assert_fail("newCurrent >= maxDist",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x45c,
                    "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
    }
    if (uVar6 - uVar10 < 2) {
      __assert_fail("newCurrent - maxDist >= ZSTD_WINDOW_START_INDEX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x45d,
                    "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
    }
    if (uVar6 < uVar9) {
      __assert_fail("window->lowLimit <= newCurrent",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x45f,
                    "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
    }
    if (uVar6 < uVar12) {
      __assert_fail("window->dictLimit <= newCurrent",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x460,
                    "U32 ZSTD_window_correctOverflow(ZSTD_window_t *, U32, U32, const void *)");
    }
    pUVar3 = &(ms->window).nbOverflowCorrections;
    *pUVar3 = *pUVar3 + 1;
    if (ws->tableValidEnd < ws->objectEnd) {
      __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x222,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
    }
    if (ws->allocStart < ws->tableValidEnd) {
      __assert_fail("ws->tableValidEnd <= ws->allocStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x223,"void ZSTD_cwksp_mark_tables_dirty(ZSTD_cwksp *)");
    }
    ws->tableValidEnd = ws->objectEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    ZSTD_reduceTable(ms->hashTable,1 << ((byte)(params->cParams).hashLog & 0x1f),uVar16);
    iVar7 = ZSTD_allocateChainTable
                      ((params->cParams).strategy,params->useRowMatchFinder,ms->dedicatedDictSearch)
    ;
    if (iVar7 != 0) {
      uVar10 = (params->cParams).chainLog;
      UVar15 = 1 << ((byte)uVar10 & 0x1f);
      pUVar3 = ms->chainTable;
      if ((params->cParams).strategy == ZSTD_btlazy2) {
        UVar8 = UVar15 + 0xf;
        if (-1 < (int)UVar15) {
          UVar8 = UVar15;
        }
        if (uVar10 < 4) {
          __assert_fail("(size & (ZSTD_ROWSIZE-1)) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0xa03,
                        "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)"
                       );
        }
        if (uVar10 == 0x1f) {
          __assert_fail("size < (1U<<31)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0xa04,
                        "void ZSTD_reduceTable_internal(U32 *const, const U32, const U32, const int)"
                       );
        }
        if (0xf < (int)UVar15) {
          iVar7 = 0;
          iVar11 = 0;
          do {
            lVar14 = 0;
            do {
              uVar10 = pUVar3[iVar7 + lVar14];
              UVar15 = uVar10 - uVar16;
              if (uVar10 < uVar13) {
                UVar15 = 0;
              }
              if (uVar10 == 1) {
                UVar15 = 1;
              }
              pUVar3[iVar7 + lVar14] = UVar15;
              lVar14 = lVar14 + 1;
            } while ((int)lVar14 != 0x10);
            iVar7 = iVar7 + 0x10;
            iVar11 = iVar11 + 1;
          } while (iVar11 != (int)UVar8 >> 4);
        }
      }
      else {
        ZSTD_reduceTable(pUVar3,UVar15,uVar16);
      }
    }
    if (ms->hashLog3 != 0) {
      ZSTD_reduceTable(ms->hashTable3,1 << ((byte)ms->hashLog3 & 0x1f),uVar16);
    }
    pvVar4 = ws->tableValidEnd;
    if (pvVar4 < ws->objectEnd) {
      __assert_fail("ws->tableValidEnd >= ws->objectEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x22a,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
    }
    if (ws->allocStart < pvVar4) {
      __assert_fail("ws->tableValidEnd <= ws->allocStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_cwksp.h"
                    ,0x22b,"void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *)");
    }
    if (pvVar4 < ws->tableEnd) {
      ws->tableValidEnd = ws->tableEnd;
    }
    ZSTD_cwksp_assert_internal_consistency(ws);
    UVar15 = ms->nextToUpdate - uVar16;
    if (ms->nextToUpdate < uVar16) {
      UVar15 = 0;
    }
    ms->nextToUpdate = UVar15;
    ms->loadedDictEnd = 0;
    ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  }
  return;
}

Assistant:

static void ZSTD_overflowCorrectIfNeeded(ZSTD_matchState_t* ms,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         void const* ip,
                                         void const* iend)
{
    U32 const cycleLog = ZSTD_cycleLog(params->cParams.chainLog, params->cParams.strategy);
    U32 const maxDist = (U32)1 << params->cParams.windowLog;
    if (ZSTD_window_needOverflowCorrection(ms->window, cycleLog, maxDist, ms->loadedDictEnd, ip, iend)) {
        U32 const correction = ZSTD_window_correctOverflow(&ms->window, cycleLog, maxDist, ip);
        ZSTD_STATIC_ASSERT(ZSTD_CHAINLOG_MAX <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX_32 <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX <= 31);
        ZSTD_cwksp_mark_tables_dirty(ws);
        ZSTD_reduceIndex(ms, params, correction);
        ZSTD_cwksp_mark_tables_clean(ws);
        if (ms->nextToUpdate < correction) ms->nextToUpdate = 0;
        else ms->nextToUpdate -= correction;
        /* invalidate dictionaries on overflow correction */
        ms->loadedDictEnd = 0;
        ms->dictMatchState = NULL;
    }
}